

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O0

yajl_val yajl_tree_get(yajl_val n,char **path,yajl_type type)

{
  char *pcVar1;
  int iVar2;
  yajl_type in_EDX;
  long *in_RSI;
  yajl_val in_RDI;
  bool bVar3;
  size_t len;
  size_t i;
  char *local_28;
  long *local_18;
  yajl_val local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RSI == (long *)0x0) {
    return (yajl_val)0x0;
  }
  do {
    bVar3 = false;
    if (local_10 != (yajl_val)0x0) {
      bVar3 = *local_18 != 0;
    }
    if (!bVar3) {
      if (((local_10 != (yajl_val)0x0) && (in_EDX != yajl_t_any)) && (in_EDX != local_10->type)) {
        local_10 = (yajl_val)0x0;
      }
      return local_10;
    }
    if (local_10->type != yajl_t_object) {
      return (yajl_val)0x0;
    }
    pcVar1 = (local_10->u).number.r;
    for (local_28 = (char *)0x0; local_28 < pcVar1; local_28 = local_28 + 1) {
      iVar2 = strcmp((char *)*local_18,*(char **)((local_10->u).string + (long)local_28 * 8));
      if (iVar2 == 0) {
        local_10 = (local_10->u).object.values[(long)local_28];
        break;
      }
    }
    if (local_28 == pcVar1) {
      return (yajl_val)0x0;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

yajl_val yajl_tree_get(yajl_val n, const char ** path, yajl_type type)
{
    if (!path) return NULL;
    while (n && *path) {
        size_t i;
        size_t len;

        if (n->type != yajl_t_object) return NULL;
        len = n->u.object.len;
        for (i = 0; i < len; i++) {
            if (!strcmp(*path, n->u.object.keys[i])) {
                n = n->u.object.values[i];
                break;
            }
        }
        if (i == len) return NULL;
        path++;
    }
    if (n && type != yajl_t_any && type != n->type) n = NULL;
    return n;
}